

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall ON_Curve::FrameAt(ON_Curve *this,double t,ON_Plane *plane)

{
  bool bVar1;
  double *pdVar2;
  ON_3dVector local_e8;
  ON_3dVector local_d0;
  undefined1 local_b8 [8];
  ON_3dVector K;
  ON_3dVector T;
  ON_3dVector d2;
  ON_3dVector d1;
  ON_3dPoint pt;
  ON_Interval domain;
  bool rc;
  ON_Plane *plane_local;
  double t_local;
  ON_Curve *this_local;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  pdVar2 = ON_Interval::operator[]((ON_Interval *)&pt.z,0);
  if ((t < *pdVar2 - 2.220446049250313e-16) ||
     (pdVar2 = ON_Interval::operator[]((ON_Interval *)&pt.z,1), *pdVar2 + 2.220446049250313e-16 < t)
     ) {
    this_local._7_1_ = false;
  }
  else {
    domain.m_t[1]._7_1_ =
         Ev2Der(this,t,(ON_3dPoint *)&d1.z,(ON_3dVector *)&d2.z,(ON_3dVector *)&T.z,0,(int *)0x0);
    if ((domain.m_t[1]._7_1_) &&
       (domain.m_t[1]._7_1_ =
             ON_EvCurvature((ON_3dVector *)&d2.z,(ON_3dVector *)&T.z,(ON_3dVector *)&K.z,
                            (ON_3dVector *)local_b8), domain.m_t[1]._7_1_)) {
      bVar1 = ON_3dVector::Unitize((ON_3dVector *)local_b8);
      if (!bVar1) {
        ON_3dVector::PerpendicularTo((ON_3dVector *)local_b8,(ON_3dVector *)&K.z);
        ON_3dVector::Unitize((ON_3dVector *)local_b8);
      }
      (plane->origin).x = d1.z;
      (plane->origin).y = pt.x;
      (plane->origin).z = pt.y;
      (plane->xaxis).x = K.z;
      (plane->xaxis).y = T.x;
      (plane->xaxis).z = T.y;
      (plane->yaxis).x = (double)local_b8;
      (plane->yaxis).y = K.x;
      (plane->yaxis).z = K.y;
      ON_CrossProduct(&local_d0,&plane->xaxis,&plane->yaxis);
      (plane->zaxis).x = local_d0.x;
      (plane->zaxis).y = local_d0.y;
      (plane->zaxis).z = local_d0.z;
      bVar1 = ON_3dVector::Unitize(&plane->zaxis);
      if (!bVar1) {
        return false;
      }
      ON_Plane::UpdateEquation(plane);
      domain.m_t[1]._7_1_ = ON_Plane::IsValid(plane);
      if (!domain.m_t[1]._7_1_) {
        ON_CrossProduct(&local_e8,&plane->zaxis,&plane->xaxis);
        (plane->yaxis).x = local_e8.x;
        (plane->yaxis).y = local_e8.y;
        (plane->yaxis).z = local_e8.z;
        ON_3dVector::Unitize(&plane->yaxis);
        domain.m_t[1]._7_1_ = ON_Plane::UpdateEquation(plane);
      }
    }
    this_local._7_1_ = domain.m_t[1]._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Curve::FrameAt( double t, ON_Plane& plane) const
{
  bool rc = false;
  ON_Interval domain = Domain();
  if( t < domain[0] - ON_EPSILON || t > domain[1] + ON_EPSILON)
    return false;

  ON_3dPoint pt;
  ON_3dVector d1, d2;
  rc = Ev2Der( t, pt, d1, d2 );
  if (rc)
  {
    ON_3dVector T, K;
    rc = ON_EvCurvature(d1, d2, T, K);
    if (rc)
    {
      if (!K.Unitize())
      {
        K.PerpendicularTo(T);
        K.Unitize();
      }
      plane.origin = pt;
      plane.xaxis = T;
      plane.yaxis = K;
      plane.zaxis = ON_CrossProduct(plane.xaxis, plane.yaxis);
      if (!plane.zaxis.Unitize())
        return false;
      plane.UpdateEquation();
      rc = plane.IsValid();
      if (!rc)
      {
        //26 Aug 2015 - Chuck - If K is extremely short, but can still be unitized, the result may not be perpendicular to T.
        plane.yaxis = ON_CrossProduct(plane.zaxis, plane.xaxis);
        plane.yaxis.Unitize();
        rc = plane.UpdateEquation();
      }
    }
  }
  return rc;
}